

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.h
# Opt level: O1

void __thiscall bloaty::Options::add_data_source(Options *this,char *value)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  char *pcVar3;
  LogMessage *other;
  long *plVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O1/src/bloaty.pb.h"
               ,0x534);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pRVar2 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00176dae:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->data_source_).super_RepeatedPtrFieldBase,
               (this->data_source_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      plVar4 = (long *)pRVar2->elements[iVar1];
      goto LAB_00176e1e;
    }
    if (pRVar2->allocated_size == (this->data_source_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_00176dae;
  }
  pRVar2 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (this->data_source_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    plVar4 = (long *)operator_new(0x20);
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      google::protobuf::Arena::OnArenaAllocation
                (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    plVar4 = (long *)google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                               (&this_00->impl_,0x20,
                                google::protobuf::internal::
                                arena_destruct_object<std::__cxx11::string>);
  }
  *plVar4 = (long)(plVar4 + 2);
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pRVar2 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
  (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = plVar4;
LAB_00176e1e:
  pcVar3 = (char *)plVar4[1];
  strlen(value);
  std::__cxx11::string::_M_replace((ulong)plVar4,0,pcVar3,(ulong)value);
  return;
}

Assistant:

inline void Options::add_data_source(const char* value) {
  GOOGLE_DCHECK(value != nullptr);
  data_source_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:bloaty.Options.data_source)
}